

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache.c
# Opt level: O1

record_data * get_cache_A_record(cache *Cache,char *label)

{
  record_data *prVar1;
  
  pthread_mutex_lock((pthread_mutex_t *)&Cache->lock);
  prVar1 = _get_cache_A_record(Cache,label);
  pthread_mutex_unlock((pthread_mutex_t *)&Cache->lock);
  return prVar1;
}

Assistant:

struct record_data *_get_cache_A_record(cache* Cache,const char *label) {
  if(Cache->is_init==false){
    log_error("cache not init");
    return NULL;
  }
  // pthread_rwlock_rdlock(&Cache->rwlock);//读锁
  struct record *record = get(Cache,label);
 
  if (!record){
    // pthread_rwlock_unlock(&Cache->rwlock);// 释放读锁
    return NULL;
  }
  #ifdef LOG_INCLUDED
  log_debug("get cache ;label:%s  label_finded= %s",label,((struct record_data*)record->data)->label);
  #endif 

  if (Cache->check(record)){
    #ifdef LOG_INCLUDED
    log_debug("%s timeout",label);
    #endif
    // pthread_rwlock_unlock(&Cache->rwlock);// 释放读锁
    // pthread_rwlock_wrlock(&Cache->rwlock);
    remove_record(Cache,record);
    // pthread_rwlock_unlock(&Cache->rwlock);//释放写锁
    return NULL;
  }
  int now = get_record_addr(Cache,record);
  // pthread_rwlock_unlock(&Cache->rwlock);// 释放读锁
  // pthread_rwlock_wrlock(&Cache->rwlock);
  if (now != Cache->first) {
    linklist_remove_node(Cache, &Cache->records[now]);
    Cache->records[LRU_BUFFER_HEAD_POINT].next = now;
    record->last = LRU_BUFFER_HEAD_POINT;
    record->next = Cache->first;
    Cache->first = Cache->records[Cache->first].last = now;
  }
  // pthread_rwlock_unlock(&Cache->rwlock);// 有问题
  return (struct record_data *)record->data;
}